

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Array<asl::Var>_> * __thiscall
asl::Array<asl::Array<asl::Var>_>::operator=
          (Array<asl::Array<asl::Var>_> *this,Array<asl::Array<asl::Var>_> *b)

{
  Array<asl::Var> *pAVar1;
  
  if (this->_a != b->_a) {
    LOCK();
    pAVar1 = this->_a + -1;
    *(int *)&pAVar1->_a = *(int *)&pAVar1->_a + -1;
    UNLOCK();
    if (*(int *)&pAVar1->_a == 0) {
      free(this,b);
    }
    pAVar1 = b->_a;
    this->_a = pAVar1;
    LOCK();
    pAVar1 = pAVar1 + -1;
    *(int *)&pAVar1->_a = *(int *)&pAVar1->_a + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

Array& operator=(const Array& b)
	{
		if (_a == b._a)
			return *this;
		if(--d().rc==0) free();
		_a = b._a;
		++d().rc;
		return *this;
	}